

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O1

char * ecdsa_cache_str(ssh_key *key)

{
  char *pcVar1;
  mp_int *y;
  mp_int *x;
  mp_int *local_28;
  mp_int *local_20;
  
  ecc_weierstrass_get_affine((WeierstrassPoint *)key[-2].vt,&local_20,&local_28);
  pcVar1 = ecc_cache_str_shared((char *)(key[-3].vt)->new_priv,local_20,local_28);
  mp_free(local_20);
  mp_free(local_28);
  return pcVar1;
}

Assistant:

static char *ecdsa_cache_str(ssh_key *key)
{
    struct ecdsa_key *ek = container_of(key, struct ecdsa_key, sshk);
    mp_int *x, *y;

    ecc_weierstrass_get_affine(ek->publicKey, &x, &y);
    char *toret = ecc_cache_str_shared(ek->curve->name, x, y);
    mp_free(x);
    mp_free(y);
    return toret;
}